

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O1

void __thiscall Network::check_consistency(Network *this)

{
  pointer psVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  
  uVar3 = (ulong)((long)(this->node_list).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->node_list).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  if ((int)uVar3 != 0) {
    psVar1 = (this->links).
             super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      for (p_Var4 = *(_Base_ptr *)((long)&psVar1[uVar8]._M_t._M_impl.super__Rb_tree_header + 0x10);
          p_Var4 != &psVar1[uVar8]._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        p_Var5 = &psVar1[p_Var4[1]._M_color]._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = *(_Base_ptr *)
                  ((long)&psVar1[p_Var4[1]._M_color]._M_t._M_impl.super__Rb_tree_header + 8);
        p_Var6 = &p_Var5->_M_header;
        for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
            p_Var2 = (&p_Var2->_M_left)[(uint)*(size_t *)(p_Var2 + 1) < uVar8]) {
          if (uVar8 <= (uint)*(size_t *)(p_Var2 + 1)) {
            p_Var6 = p_Var2;
          }
        }
        p_Var7 = p_Var5;
        if (((_Rb_tree_header *)p_Var6 != p_Var5) &&
           (p_Var7 = (_Rb_tree_header *)p_Var6,
           uVar8 < (uint)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
          p_Var7 = p_Var5;
        }
        if (p_Var7 == p_Var5) {
          __assert_fail("links[node_j].count(node_i) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/network.h"
                        ,0x5b,"void Network::check_consistency() const");
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar3 & 0xffffffff));
  }
  return;
}

Assistant:

void check_consistency() const {
        for (unsigned int node_i = 0; node_i < getN(); node_i++)
            for(unsigned int node_j : links[node_i])
                assert(links[node_j].count(node_i) == 1);
    }